

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void rmdir_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (req == &rmdir_req) {
    if (rmdir_req.fs_type == UV_FS_RMDIR) {
      if (rmdir_req.result == 0) {
        rmdir_cb_count = rmdir_cb_count + 1;
        if (rmdir_req.path == (char *)0x0) {
          pcVar3 = "req->path";
          uVar2 = 0x247;
        }
        else {
          iVar1 = bcmp(rmdir_req.path,"test_dir",9);
          if (iVar1 == 0) {
            uv_fs_req_cleanup(&rmdir_req);
            return;
          }
          pcVar3 = "memcmp(req->path, \"test_dir\\0\", 9) == 0";
          uVar2 = 0x248;
        }
      }
      else {
        pcVar3 = "req->result == 0";
        uVar2 = 0x245;
      }
    }
    else {
      pcVar3 = "req->fs_type == UV_FS_RMDIR";
      uVar2 = 0x244;
    }
  }
  else {
    pcVar3 = "req == &rmdir_req";
    uVar2 = 0x243;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void rmdir_cb(uv_fs_t* req) {
  ASSERT(req == &rmdir_req);
  ASSERT(req->fs_type == UV_FS_RMDIR);
  ASSERT(req->result == 0);
  rmdir_cb_count++;
  ASSERT(req->path);
  ASSERT(memcmp(req->path, "test_dir\0", 9) == 0);
  uv_fs_req_cleanup(req);
}